

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_add_static_string_option(void)

{
  int iVar1;
  char *local_58;
  char *args [3];
  char local_32 [8];
  char b [10];
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)(b + 2),0,"program");
  if (iVar1 == 0) {
    local_58 = "program";
    args[0] = "--beta";
    args[1] = "abc";
    iVar1 = cargo_add_option((cargo_t)b._2_8_,0,"--beta -b","Description",".s#",local_32,10);
    if (iVar1 == 0) {
      iVar1 = cargo_parse((cargo_t)b._2_8_,0,1,3,&local_58);
      if (iVar1 == 0) {
        printf("Attempt to parse value: abc\n");
        iVar1 = strcmp(local_32,"abc");
        if (iVar1 != 0) {
          pcStack_18 = "Failed to parse correct value abc";
        }
      }
      else {
        pcStack_18 = "Failed to parse static char * with value \"abc\"";
      }
    }
    else {
      pcStack_18 = "Failed to add valid static string option";
    }
    cargo_destroy((cargo_t *)(b + 2));
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_add_static_string_option)
{
    char b[10];
    char *args[] = { "program", "--beta", "abc" };
    ret = cargo_add_option(cargo, 0, "--beta -b",
                            "Description",
                            ".s#",
                            &b, sizeof(b));
    cargo_assert(ret == 0, "Failed to add valid static string option");

    if (cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args))
    {
        msg = "Failed to parse static char * with value \"abc\"";
        goto fail;
    }
    printf("Attempt to parse value: abc\n");
    cargo_assert(!strcmp(b, "abc"), "Failed to parse correct value abc");
    _TEST_CLEANUP();
}